

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc_error.c
# Opt level: O3

Translation_Error *
get_translation_error(char *error_message,size_t line,size_t column,char *filename)

{
  Translation_Error *in_RAX;
  
  return in_RAX;
}

Assistant:

struct Translation_Error* get_translation_error(const char *error_message,size_t line,size_t column,const char *filename)
{
	struct Translation_Error *ret;
	ret=malloc(sizeof(struct Translation_Error));
	ret->error_message=error_message;
	ret->column=column;
	ret->line=line;
	ret->filename=filename;
}